

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimClassesRefine(Cec_ManSim_t *p)

{
  Cec_ParSim_t *pCVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  
  Gia_ManCreateValueRefs(p->pAig);
  p->nWords = p->pPars->nWords;
  iVar4 = 0;
  do {
    pCVar1 = p->pPars;
    if (pCVar1->nRounds <= iVar4) {
      if (pCVar1->fVerbose != 0) {
        pGVar2 = p->pAig;
        fVar5 = Cec_MemUsage(p);
        Gia_ManEquivPrintClasses(pGVar2,0,fVar5);
        return 0;
      }
      return 0;
    }
    if ((iVar4 % (pCVar1->nRounds / 5) == 0) && (pCVar1->fVerbose != 0)) {
      pGVar2 = p->pAig;
      fVar5 = Cec_MemUsage(p);
      Gia_ManEquivPrintClasses(pGVar2,0,fVar5);
    }
    Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
    iVar3 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
    iVar4 = iVar4 + 1;
  } while (iVar3 == 0);
  return 1;
}

Assistant:

int Cec_ManSimClassesRefine( Cec_ManSim_t * p )
{
    int i;
    Gia_ManCreateValueRefs( p->pAig );
    p->nWords = p->pPars->nWords;
    for ( i = 0; i < p->pPars->nRounds; i++ )
    {
        if ( (i % (p->pPars->nRounds / 5)) == 0 && p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    if ( p->pPars->fVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    return 0;
}